

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<8,_1,_true,_embree::avx2::SubGridIntersector1Pluecker<8,_true>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  ushort uVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  byte bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  uint uVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  Geometry *pGVar43;
  long lVar44;
  RTCIntersectArguments *pRVar45;
  ulong uVar46;
  long lVar47;
  ulong *puVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  undefined4 uVar55;
  ulong unaff_R14;
  size_t mask;
  ulong uVar56;
  bool bVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  undefined1 auVar63 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar76;
  undefined1 auVar77 [16];
  float fVar87;
  float fVar88;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar89;
  undefined1 auVar86 [32];
  undefined8 uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar108 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar124;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar130;
  float fVar132;
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar140;
  undefined1 auVar127 [32];
  float fVar129;
  float fVar131;
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar139;
  undefined1 auVar128 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  float fVar144;
  undefined1 auVar145 [32];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  float fVar155;
  float fVar156;
  undefined1 auVar157 [32];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [64];
  UVIdentity<8> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [564];
  undefined1 local_1851;
  ulong local_1850;
  ulong local_1848;
  ulong local_1840;
  Ray *local_1838;
  RayQueryContext *local_1830;
  ulong *local_1828;
  uint local_181c;
  uint local_1818;
  int local_1814;
  ulong local_1810;
  Scene *local_1808;
  RTCRayQueryContext *local_1800;
  undefined1 auStack_17f8 [24];
  ulong local_17d0;
  ulong local_17c8;
  ulong local_17c0;
  ulong local_17b8;
  ulong local_17b0;
  ulong local_17a8;
  ulong local_17a0;
  ulong local_1798;
  ulong local_1790;
  ulong local_1788;
  ulong local_1780;
  long local_1778;
  long local_1770;
  long local_1768;
  undefined8 local_1760;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float local_173c;
  float local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  uint local_1724;
  uint local_1720;
  RTCFilterFunctionNArguments local_1710;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  RTCIntersectArguments *local_1680;
  undefined1 auStack_1678 [24];
  Geometry *local_1660;
  undefined1 auStack_1658 [24];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined1 local_1480 [32];
  undefined4 local_1460;
  undefined4 uStack_145c;
  undefined4 uStack_1458;
  undefined4 uStack_1454;
  undefined4 uStack_1450;
  undefined4 uStack_144c;
  undefined4 uStack_1448;
  undefined4 uStack_1444;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 *local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200 [570];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar75 = ray->tfar;
    if (0.0 <= fVar75) {
      puVar48 = local_1200 + 1;
      local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar1 = (ray->dir).field_0;
      auVar10 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar96._8_4_ = 0x7fffffff;
      auVar96._0_8_ = 0x7fffffff7fffffff;
      auVar96._12_4_ = 0x7fffffff;
      auVar96 = vandps_avx((undefined1  [16])aVar1,auVar96);
      auVar105._8_4_ = 0x219392ef;
      auVar105._0_8_ = 0x219392ef219392ef;
      auVar105._12_4_ = 0x219392ef;
      auVar96 = vcmpps_avx(auVar96,auVar105,1);
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = &DAT_3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar105 = vdivps_avx(auVar106,(undefined1  [16])aVar1);
      auVar107._8_4_ = 0x5d5e0b6b;
      auVar107._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar107._12_4_ = 0x5d5e0b6b;
      auVar96 = vblendvps_avx(auVar105,auVar107,auVar96);
      auVar97._0_4_ = auVar96._0_4_ * 0.99999964;
      auVar97._4_4_ = auVar96._4_4_ * 0.99999964;
      auVar97._8_4_ = auVar96._8_4_ * 0.99999964;
      auVar97._12_4_ = auVar96._12_4_ * 0.99999964;
      auVar91._0_4_ = auVar96._0_4_ * 1.0000004;
      auVar91._4_4_ = auVar96._4_4_ * 1.0000004;
      auVar91._8_4_ = auVar96._8_4_ * 1.0000004;
      auVar91._12_4_ = auVar96._12_4_ * 1.0000004;
      uVar55 = *(undefined4 *)&(ray->org).field_0;
      local_1500._4_4_ = uVar55;
      local_1500._0_4_ = uVar55;
      local_1500._8_4_ = uVar55;
      local_1500._12_4_ = uVar55;
      local_1500._16_4_ = uVar55;
      local_1500._20_4_ = uVar55;
      local_1500._24_4_ = uVar55;
      local_1500._28_4_ = uVar55;
      auVar128 = ZEXT3264(local_1500);
      uVar55 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1520._4_4_ = uVar55;
      local_1520._0_4_ = uVar55;
      local_1520._8_4_ = uVar55;
      local_1520._12_4_ = uVar55;
      local_1520._16_4_ = uVar55;
      local_1520._20_4_ = uVar55;
      local_1520._24_4_ = uVar55;
      local_1520._28_4_ = uVar55;
      auVar143 = ZEXT3264(local_1520);
      uVar55 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1540._4_4_ = uVar55;
      local_1540._0_4_ = uVar55;
      local_1540._8_4_ = uVar55;
      local_1540._12_4_ = uVar55;
      local_1540._16_4_ = uVar55;
      local_1540._20_4_ = uVar55;
      local_1540._24_4_ = uVar55;
      local_1540._28_4_ = uVar55;
      auVar146 = ZEXT3264(local_1540);
      auVar96 = vmovshdup_avx(auVar97);
      uVar90 = auVar96._0_8_;
      local_1580._8_8_ = uVar90;
      local_1580._0_8_ = uVar90;
      local_1580._16_8_ = uVar90;
      local_1580._24_8_ = uVar90;
      auVar153 = ZEXT3264(local_1580);
      auVar106 = vshufpd_avx(auVar97,auVar97,1);
      auVar105 = vshufps_avx(auVar97,auVar97,0xaa);
      uVar90 = auVar105._0_8_;
      local_15a0._8_8_ = uVar90;
      local_15a0._0_8_ = uVar90;
      local_15a0._16_8_ = uVar90;
      local_15a0._24_8_ = uVar90;
      auVar154 = ZEXT3264(local_15a0);
      auVar105 = vmovshdup_avx(auVar91);
      uVar90 = auVar105._0_8_;
      local_15e0._8_8_ = uVar90;
      local_15e0._0_8_ = uVar90;
      local_15e0._16_8_ = uVar90;
      local_15e0._24_8_ = uVar90;
      auVar158 = ZEXT3264(local_15e0);
      auVar105 = vshufps_avx(auVar91,auVar91,0xaa);
      uVar49 = (ulong)(auVar97._0_4_ < 0.0) << 5;
      uVar50 = (ulong)(auVar96._0_4_ < 0.0) << 5 | 0x40;
      uVar90 = auVar105._0_8_;
      local_1600._8_8_ = uVar90;
      local_1600._0_8_ = uVar90;
      local_1600._16_8_ = uVar90;
      local_1600._24_8_ = uVar90;
      auVar104 = ZEXT3264(local_1600);
      uVar51 = (ulong)(auVar106._0_4_ < 0.0) << 5 | 0x80;
      uVar54 = uVar49 ^ 0x20;
      uVar56 = uVar50 ^ 0x20;
      uVar46 = uVar51 ^ 0x20;
      uVar55 = auVar10._0_4_;
      local_1620._4_4_ = uVar55;
      local_1620._0_4_ = uVar55;
      local_1620._8_4_ = uVar55;
      local_1620._12_4_ = uVar55;
      local_1620._16_4_ = uVar55;
      local_1620._20_4_ = uVar55;
      local_1620._24_4_ = uVar55;
      local_1620._28_4_ = uVar55;
      auVar112 = ZEXT3264(local_1620);
      local_1640._4_4_ = fVar75;
      local_1640._0_4_ = fVar75;
      local_1640._8_4_ = fVar75;
      local_1640._12_4_ = fVar75;
      local_1640._16_4_ = fVar75;
      local_1640._20_4_ = fVar75;
      local_1640._24_4_ = fVar75;
      local_1640._28_4_ = fVar75;
      auVar119 = ZEXT3264(local_1640);
      local_1790 = (ulong)(((uint)(auVar97._0_4_ < 0.0) << 5) >> 2);
      local_1798 = uVar54 >> 2;
      local_17a0 = uVar50 >> 2;
      local_17a8 = uVar56 >> 2;
      local_14e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_14e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_17b0 = uVar51 >> 2;
      local_1480 = vperm2f128_avx(local_14e0,mm_lookupmask_ps._0_32_,2);
      local_17b8 = uVar46 >> 2;
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = &DAT_3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar78._16_4_ = 0x3f800000;
      auVar78._20_4_ = 0x3f800000;
      auVar78._24_4_ = 0x3f800000;
      auVar78._28_4_ = 0x3f800000;
      auVar102._8_4_ = 0xbf800000;
      auVar102._0_8_ = 0xbf800000bf800000;
      auVar102._12_4_ = 0xbf800000;
      auVar102._16_4_ = 0xbf800000;
      auVar102._20_4_ = 0xbf800000;
      auVar102._24_4_ = 0xbf800000;
      auVar102._28_4_ = 0xbf800000;
      _local_14a0 = vblendvps_avx(auVar78,auVar102,local_1480);
      fVar75 = auVar97._0_4_;
      fVar62 = auVar97._0_4_;
      fVar70 = auVar97._0_4_;
      fVar71 = auVar97._0_4_;
      fVar72 = auVar97._0_4_;
      fVar73 = auVar97._0_4_;
      fVar74 = auVar91._0_4_;
      fVar76 = auVar91._0_4_;
      fVar87 = auVar91._0_4_;
      fVar88 = auVar91._0_4_;
      fVar89 = auVar91._0_4_;
      fVar155 = auVar91._0_4_;
      local_1850 = uVar51;
      local_1848 = uVar50;
      local_1840 = uVar49;
      local_1838 = ray;
      local_1830 = context;
      local_17c0 = uVar54;
      local_15c0 = auVar91._0_4_;
      fStack_15bc = auVar91._0_4_;
      fStack_15b8 = auVar91._0_4_;
      fStack_15b4 = auVar91._0_4_;
      fStack_15b0 = auVar91._0_4_;
      fStack_15ac = auVar91._0_4_;
      fStack_15a8 = auVar91._0_4_;
      fStack_15a4 = auVar91._0_4_;
      local_1560 = auVar97._0_4_;
      fStack_155c = auVar97._0_4_;
      fStack_1558 = auVar97._0_4_;
      fStack_1554 = auVar97._0_4_;
      fStack_1550 = auVar97._0_4_;
      fStack_154c = auVar97._0_4_;
      fStack_1548 = auVar97._0_4_;
      fStack_1544 = auVar97._0_4_;
      do {
        if (puVar48 == local_1200) {
          return;
        }
        uVar53 = puVar48[-1];
        puVar48 = puVar48 + -1;
        do {
          if ((uVar53 & 8) == 0) {
            auVar102 = vsubps_avx(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar49),auVar128._0_32_);
            auVar11._4_4_ = fVar75 * auVar102._4_4_;
            auVar11._0_4_ = auVar97._0_4_ * auVar102._0_4_;
            auVar11._8_4_ = fVar62 * auVar102._8_4_;
            auVar11._12_4_ = fVar70 * auVar102._12_4_;
            auVar11._16_4_ = fVar71 * auVar102._16_4_;
            auVar11._20_4_ = fVar72 * auVar102._20_4_;
            auVar11._24_4_ = fVar73 * auVar102._24_4_;
            auVar11._28_4_ = auVar102._28_4_;
            auVar102 = vsubps_avx(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar50),auVar143._0_32_);
            auVar15._4_4_ = auVar153._4_4_ * auVar102._4_4_;
            auVar15._0_4_ = auVar153._0_4_ * auVar102._0_4_;
            auVar15._8_4_ = auVar153._8_4_ * auVar102._8_4_;
            auVar15._12_4_ = auVar153._12_4_ * auVar102._12_4_;
            auVar15._16_4_ = auVar153._16_4_ * auVar102._16_4_;
            auVar15._20_4_ = auVar153._20_4_ * auVar102._20_4_;
            auVar15._24_4_ = auVar153._24_4_ * auVar102._24_4_;
            auVar15._28_4_ = auVar102._28_4_;
            auVar102 = vmaxps_avx(auVar11,auVar15);
            auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar51),auVar146._0_32_);
            auVar12._4_4_ = auVar154._4_4_ * auVar78._4_4_;
            auVar12._0_4_ = auVar154._0_4_ * auVar78._0_4_;
            auVar12._8_4_ = auVar154._8_4_ * auVar78._8_4_;
            auVar12._12_4_ = auVar154._12_4_ * auVar78._12_4_;
            auVar12._16_4_ = auVar154._16_4_ * auVar78._16_4_;
            auVar12._20_4_ = auVar154._20_4_ * auVar78._20_4_;
            auVar12._24_4_ = auVar154._24_4_ * auVar78._24_4_;
            auVar12._28_4_ = auVar78._28_4_;
            auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar54),auVar128._0_32_);
            auVar118._4_4_ = fVar74 * auVar78._4_4_;
            auVar118._0_4_ = auVar91._0_4_ * auVar78._0_4_;
            auVar118._8_4_ = fVar76 * auVar78._8_4_;
            auVar118._12_4_ = fVar87 * auVar78._12_4_;
            auVar118._16_4_ = fVar88 * auVar78._16_4_;
            auVar118._20_4_ = fVar89 * auVar78._20_4_;
            auVar118._24_4_ = fVar155 * auVar78._24_4_;
            auVar118._28_4_ = auVar78._28_4_;
            auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar56),auVar143._0_32_);
            auVar103._4_4_ = auVar158._4_4_ * auVar78._4_4_;
            auVar103._0_4_ = auVar158._0_4_ * auVar78._0_4_;
            auVar103._8_4_ = auVar158._8_4_ * auVar78._8_4_;
            auVar103._12_4_ = auVar158._12_4_ * auVar78._12_4_;
            auVar103._16_4_ = auVar158._16_4_ * auVar78._16_4_;
            auVar103._20_4_ = auVar158._20_4_ * auVar78._20_4_;
            auVar103._24_4_ = auVar158._24_4_ * auVar78._24_4_;
            auVar103._28_4_ = auVar78._28_4_;
            auVar11 = vminps_avx(auVar118,auVar103);
            auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar46),auVar146._0_32_);
            auVar13._4_4_ = auVar104._4_4_ * auVar78._4_4_;
            auVar13._0_4_ = auVar104._0_4_ * auVar78._0_4_;
            auVar13._8_4_ = auVar104._8_4_ * auVar78._8_4_;
            auVar13._12_4_ = auVar104._12_4_ * auVar78._12_4_;
            auVar13._16_4_ = auVar104._16_4_ * auVar78._16_4_;
            auVar13._20_4_ = auVar104._20_4_ * auVar78._20_4_;
            auVar13._24_4_ = auVar104._24_4_ * auVar78._24_4_;
            auVar13._28_4_ = auVar78._28_4_;
            auVar78 = vmaxps_avx(auVar12,auVar112._0_32_);
            auVar102 = vmaxps_avx(auVar102,auVar78);
            auVar78 = vminps_avx(auVar13,auVar119._0_32_);
            auVar78 = vminps_avx(auVar11,auVar78);
            auVar102 = vcmpps_avx(auVar102,auVar78,2);
            uVar55 = vmovmskps_avx(auVar102);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar55);
          }
          if ((uVar53 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar40 = 4;
            }
            else {
              uVar52 = uVar53 & 0xfffffffffffffff0;
              lVar41 = 0;
              for (uVar53 = unaff_R14; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000)
              {
                lVar41 = lVar41 + 1;
              }
              iVar40 = 0;
              for (uVar42 = unaff_R14 - 1 & unaff_R14; uVar53 = *(ulong *)(uVar52 + lVar41 * 8),
                  uVar42 != 0; uVar42 = uVar42 - 1 & uVar42) {
                *puVar48 = uVar53;
                puVar48 = puVar48 + 1;
                lVar41 = 0;
                for (uVar53 = uVar42; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000)
                {
                  lVar41 = lVar41 + 1;
                }
              }
            }
          }
          else {
            iVar40 = 6;
          }
        } while (iVar40 == 0);
        if (iVar40 == 6) {
          local_17c8 = (ulong)((uint)uVar53 & 0xf) - 8;
          bVar57 = local_17c8 != 0;
          if (bVar57) {
            uVar53 = uVar53 & 0xfffffffffffffff0;
            local_1780 = 0;
            do {
              lVar41 = local_1780 * 0x90;
              local_1768 = uVar53 + lVar41;
              uVar55 = *(undefined4 *)(uVar53 + 0x70 + lVar41);
              auVar64._4_4_ = uVar55;
              auVar64._0_4_ = uVar55;
              auVar64._8_4_ = uVar55;
              auVar64._12_4_ = uVar55;
              auVar64._16_4_ = uVar55;
              auVar64._20_4_ = uVar55;
              auVar64._24_4_ = uVar55;
              auVar64._28_4_ = uVar55;
              uVar55 = *(undefined4 *)(uVar53 + 0x7c + lVar41);
              auVar79._4_4_ = uVar55;
              auVar79._0_4_ = uVar55;
              auVar79._8_4_ = uVar55;
              auVar79._12_4_ = uVar55;
              auVar79._16_4_ = uVar55;
              auVar79._20_4_ = uVar55;
              auVar79._24_4_ = uVar55;
              auVar79._28_4_ = uVar55;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *(ulong *)(local_1790 + 0x40 + local_1768);
              auVar102 = vpmovzxbd_avx2(auVar10);
              auVar102 = vcvtdq2ps_avx(auVar102);
              auVar10 = vfmadd213ps_fma(auVar102,auVar79,auVar64);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)(local_1798 + 0x40 + local_1768);
              auVar102 = vpmovzxbd_avx2(auVar2);
              auVar102 = vcvtdq2ps_avx(auVar102);
              auVar106 = vfmadd213ps_fma(auVar102,auVar79,auVar64);
              uVar55 = *(undefined4 *)(uVar53 + 0x74 + lVar41);
              auVar65._4_4_ = uVar55;
              auVar65._0_4_ = uVar55;
              auVar65._8_4_ = uVar55;
              auVar65._12_4_ = uVar55;
              auVar65._16_4_ = uVar55;
              auVar65._20_4_ = uVar55;
              auVar65._24_4_ = uVar55;
              auVar65._28_4_ = uVar55;
              uVar55 = *(undefined4 *)(uVar53 + 0x80 + lVar41);
              auVar80._4_4_ = uVar55;
              auVar80._0_4_ = uVar55;
              auVar80._8_4_ = uVar55;
              auVar80._12_4_ = uVar55;
              auVar80._16_4_ = uVar55;
              auVar80._20_4_ = uVar55;
              auVar80._24_4_ = uVar55;
              auVar80._28_4_ = uVar55;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(local_17a0 + 0x40 + local_1768);
              auVar102 = vpmovzxbd_avx2(auVar3);
              auVar102 = vcvtdq2ps_avx(auVar102);
              auVar107 = vfmadd213ps_fma(auVar102,auVar80,auVar65);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(local_17a8 + 0x40 + local_1768);
              auVar102 = vpmovzxbd_avx2(auVar4);
              auVar102 = vcvtdq2ps_avx(auVar102);
              auVar2 = vfmadd213ps_fma(auVar102,auVar80,auVar65);
              uVar55 = *(undefined4 *)(uVar53 + 0x78 + lVar41);
              auVar66._4_4_ = uVar55;
              auVar66._0_4_ = uVar55;
              auVar66._8_4_ = uVar55;
              auVar66._12_4_ = uVar55;
              auVar66._16_4_ = uVar55;
              auVar66._20_4_ = uVar55;
              auVar66._24_4_ = uVar55;
              auVar66._28_4_ = uVar55;
              uVar55 = *(undefined4 *)(uVar53 + 0x84 + lVar41);
              auVar81._4_4_ = uVar55;
              auVar81._0_4_ = uVar55;
              auVar81._8_4_ = uVar55;
              auVar81._12_4_ = uVar55;
              auVar81._16_4_ = uVar55;
              auVar81._20_4_ = uVar55;
              auVar81._24_4_ = uVar55;
              auVar81._28_4_ = uVar55;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(local_17b0 + 0x40 + local_1768);
              auVar102 = vpmovzxbd_avx2(auVar5);
              auVar102 = vcvtdq2ps_avx(auVar102);
              auVar3 = vfmadd213ps_fma(auVar102,auVar81,auVar66);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(local_17b8 + 0x40 + local_1768);
              auVar102 = vpmovzxbd_avx2(auVar6);
              auVar102 = vcvtdq2ps_avx(auVar102);
              auVar4 = vfmadd213ps_fma(auVar102,auVar81,auVar66);
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *(ulong *)(uVar53 + 0x40 + lVar41);
              auVar77._8_8_ = 0;
              auVar77._0_8_ = *(ulong *)(uVar53 + 0x48 + lVar41);
              auVar96 = vpminub_avx(auVar63,auVar77);
              auVar105 = vpcmpeqb_avx(auVar63,auVar96);
              auVar102 = vsubps_avx(ZEXT1632(auVar10),auVar128._0_32_);
              auVar14._4_4_ = fVar75 * auVar102._4_4_;
              auVar14._0_4_ = auVar97._0_4_ * auVar102._0_4_;
              auVar14._8_4_ = fVar62 * auVar102._8_4_;
              auVar14._12_4_ = fVar70 * auVar102._12_4_;
              auVar14._16_4_ = fVar71 * auVar102._16_4_;
              auVar14._20_4_ = fVar72 * auVar102._20_4_;
              auVar14._24_4_ = fVar73 * auVar102._24_4_;
              auVar14._28_4_ = auVar102._28_4_;
              auVar102 = vsubps_avx(ZEXT1632(auVar107),auVar143._0_32_);
              auVar16._4_4_ = auVar153._4_4_ * auVar102._4_4_;
              auVar16._0_4_ = auVar153._0_4_ * auVar102._0_4_;
              auVar16._8_4_ = auVar153._8_4_ * auVar102._8_4_;
              auVar16._12_4_ = auVar153._12_4_ * auVar102._12_4_;
              auVar16._16_4_ = auVar153._16_4_ * auVar102._16_4_;
              auVar16._20_4_ = auVar153._20_4_ * auVar102._20_4_;
              auVar16._24_4_ = auVar153._24_4_ * auVar102._24_4_;
              auVar16._28_4_ = auVar102._28_4_;
              auVar102 = vmaxps_avx(auVar14,auVar16);
              auVar78 = vsubps_avx(ZEXT1632(auVar106),auVar128._0_32_);
              auVar18._4_4_ = fVar74 * auVar78._4_4_;
              auVar18._0_4_ = auVar91._0_4_ * auVar78._0_4_;
              auVar18._8_4_ = fVar76 * auVar78._8_4_;
              auVar18._12_4_ = fVar87 * auVar78._12_4_;
              auVar18._16_4_ = fVar88 * auVar78._16_4_;
              auVar18._20_4_ = fVar89 * auVar78._20_4_;
              auVar18._24_4_ = fVar155 * auVar78._24_4_;
              auVar18._28_4_ = auVar78._28_4_;
              auVar78 = vsubps_avx(ZEXT1632(auVar2),auVar143._0_32_);
              auVar19._4_4_ = auVar158._4_4_ * auVar78._4_4_;
              auVar19._0_4_ = auVar158._0_4_ * auVar78._0_4_;
              auVar19._8_4_ = auVar158._8_4_ * auVar78._8_4_;
              auVar19._12_4_ = auVar158._12_4_ * auVar78._12_4_;
              auVar19._16_4_ = auVar158._16_4_ * auVar78._16_4_;
              auVar19._20_4_ = auVar158._20_4_ * auVar78._20_4_;
              auVar19._24_4_ = auVar158._24_4_ * auVar78._24_4_;
              auVar19._28_4_ = auVar78._28_4_;
              auVar11 = vminps_avx(auVar18,auVar19);
              auVar78 = vsubps_avx(ZEXT1632(auVar3),auVar146._0_32_);
              auVar20._4_4_ = auVar154._4_4_ * auVar78._4_4_;
              auVar20._0_4_ = auVar154._0_4_ * auVar78._0_4_;
              auVar20._8_4_ = auVar154._8_4_ * auVar78._8_4_;
              auVar20._12_4_ = auVar154._12_4_ * auVar78._12_4_;
              auVar20._16_4_ = auVar154._16_4_ * auVar78._16_4_;
              auVar20._20_4_ = auVar154._20_4_ * auVar78._20_4_;
              auVar20._24_4_ = auVar154._24_4_ * auVar78._24_4_;
              auVar20._28_4_ = auVar78._28_4_;
              auVar78 = vmaxps_avx(auVar20,local_1620);
              auVar102 = vmaxps_avx(auVar102,auVar78);
              auVar78 = vsubps_avx(ZEXT1632(auVar4),auVar146._0_32_);
              auVar21._4_4_ = local_1600._4_4_ * auVar78._4_4_;
              auVar21._0_4_ = local_1600._0_4_ * auVar78._0_4_;
              auVar21._8_4_ = local_1600._8_4_ * auVar78._8_4_;
              auVar21._12_4_ = local_1600._12_4_ * auVar78._12_4_;
              auVar21._16_4_ = local_1600._16_4_ * auVar78._16_4_;
              auVar21._20_4_ = local_1600._20_4_ * auVar78._20_4_;
              auVar21._24_4_ = local_1600._24_4_ * auVar78._24_4_;
              auVar21._28_4_ = auVar78._28_4_;
              auVar78 = vminps_avx(auVar21,local_1640);
              auVar78 = vminps_avx(auVar11,auVar78);
              auVar102 = vcmpps_avx(auVar102,auVar78,2);
              auVar96 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
              auVar105 = vpmovzxbw_avx(auVar105);
              auVar96 = vpand_avx(auVar96,auVar105);
              auVar96 = vpshufb_avx(auVar96,_DAT_0205e3c0);
              bVar17 = SUB161(auVar96 >> 7,0) & 1 | (SUB161(auVar96 >> 0xf,0) & 1) << 1 |
                       (SUB161(auVar96 >> 0x17,0) & 1) << 2 | (SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                       (SUB161(auVar96 >> 0x27,0) & 1) << 4 | (SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                       (SUB161(auVar96 >> 0x37,0) & 1) << 6 | SUB161(auVar96 >> 0x3f,0) << 7;
              if (bVar17 != 0) {
                local_1788 = (ulong)bVar17;
                local_1808 = local_1830->scene;
                local_1828 = puVar48;
                do {
                  uVar54 = local_17c0;
                  lVar41 = 0;
                  for (uVar49 = local_1788; (uVar49 & 1) == 0;
                      uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                    lVar41 = lVar41 + 1;
                  }
                  uVar7 = *(ushort *)(local_1768 + lVar41 * 8);
                  uVar8 = *(ushort *)(local_1768 + 2 + lVar41 * 8);
                  local_1810 = (ulong)*(uint *)(local_1768 + 0x88);
                  local_17d0 = (ulong)*(uint *)(local_1768 + 4 + lVar41 * 8);
                  pGVar43 = (local_1808->geometries).items[local_1810].ptr;
                  local_1770 = *(long *)&pGVar43->field_0x58;
                  lVar41 = *(long *)&pGVar43[1].time_range.upper;
                  local_1778 = pGVar43[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_17d0;
                  local_1818 = uVar7 & 0x7fff;
                  local_181c = uVar8 & 0x7fff;
                  uVar39 = *(uint *)(local_1770 + 4 + local_1778);
                  uVar50 = (ulong)uVar39;
                  uVar51 = (ulong)(uVar39 * local_181c +
                                  *(int *)(local_1770 + local_1778) + local_1818);
                  p_Var9 = pGVar43[1].intersectionFilterN;
                  auVar96 = *(undefined1 (*) [16])(lVar41 + (uVar51 + 1) * (long)p_Var9);
                  auVar105 = *(undefined1 (*) [16])(lVar41 + (uVar51 + uVar50) * (long)p_Var9);
                  lVar44 = uVar51 + uVar50 + 1;
                  auVar10 = *(undefined1 (*) [16])(lVar41 + lVar44 * (long)p_Var9);
                  auVar106 = *(undefined1 (*) [16])
                              (lVar41 + (uVar51 + (-1 < (short)uVar7) + 1) * (long)p_Var9);
                  lVar47 = (ulong)(-1 < (short)uVar7) + lVar44;
                  auVar91 = *(undefined1 (*) [16])(lVar41 + lVar47 * (long)p_Var9);
                  uVar49 = 0;
                  if (-1 < (short)uVar8) {
                    uVar49 = uVar50;
                  }
                  auVar97 = *(undefined1 (*) [16])
                             (lVar41 + (uVar51 + uVar50 + uVar49) * (long)p_Var9);
                  auVar107 = *(undefined1 (*) [16])(lVar41 + (lVar44 + uVar49) * (long)p_Var9);
                  auVar125._16_16_ =
                       *(undefined1 (*) [16])(lVar41 + (uVar49 + lVar47) * (long)p_Var9);
                  auVar125._0_16_ = auVar10;
                  auVar3 = vunpcklps_avx(auVar96,auVar91);
                  auVar2 = vunpckhps_avx(auVar96,auVar91);
                  auVar4 = vunpcklps_avx(auVar106,auVar10);
                  auVar106 = vunpckhps_avx(auVar106,auVar10);
                  auVar5 = vunpcklps_avx(auVar2,auVar106);
                  auVar6 = vunpcklps_avx(auVar3,auVar4);
                  auVar106 = vunpckhps_avx(auVar3,auVar4);
                  auVar3 = vunpcklps_avx(auVar105,auVar107);
                  auVar2 = vunpckhps_avx(auVar105,auVar107);
                  auVar4 = vunpcklps_avx(auVar10,auVar97);
                  auVar97 = vunpckhps_avx(auVar10,auVar97);
                  auVar2 = vunpcklps_avx(auVar2,auVar97);
                  auVar63 = vunpcklps_avx(auVar3,auVar4);
                  auVar97 = vunpckhps_avx(auVar3,auVar4);
                  auVar82._16_16_ = auVar107;
                  auVar82._0_16_ = auVar105;
                  auVar67._16_16_ = auVar91;
                  auVar67._0_16_ = auVar96;
                  auVar102 = vunpcklps_avx(auVar67,auVar82);
                  auVar58._16_16_ = auVar10;
                  auVar58._0_16_ = *(undefined1 (*) [16])(lVar41 + (long)p_Var9 * uVar51);
                  auVar78 = vunpcklps_avx(auVar58,auVar125);
                  auVar15 = vunpcklps_avx(auVar78,auVar102);
                  auVar102 = vunpckhps_avx(auVar78,auVar102);
                  auVar78 = vunpckhps_avx(auVar67,auVar82);
                  auVar11 = vunpckhps_avx(auVar58,auVar125);
                  auVar16 = vunpcklps_avx(auVar11,auVar78);
                  auVar59._16_16_ = auVar6;
                  auVar59._0_16_ = auVar6;
                  auVar68._16_16_ = auVar106;
                  auVar68._0_16_ = auVar106;
                  auVar83._16_16_ = auVar5;
                  auVar83._0_16_ = auVar5;
                  auVar109._16_16_ = auVar63;
                  auVar109._0_16_ = auVar63;
                  auVar157._16_16_ = auVar97;
                  auVar157._0_16_ = auVar97;
                  auVar113._16_16_ = auVar2;
                  auVar113._0_16_ = auVar2;
                  uVar55 = *(undefined4 *)&(local_1838->org).field_0;
                  auVar141._4_4_ = uVar55;
                  auVar141._0_4_ = uVar55;
                  auVar141._8_4_ = uVar55;
                  auVar141._12_4_ = uVar55;
                  auVar141._16_4_ = uVar55;
                  auVar141._20_4_ = uVar55;
                  auVar141._24_4_ = uVar55;
                  auVar141._28_4_ = uVar55;
                  uVar55 = *(undefined4 *)((long)&(local_1838->org).field_0 + 4);
                  auVar150._4_4_ = uVar55;
                  auVar150._0_4_ = uVar55;
                  auVar150._8_4_ = uVar55;
                  auVar150._12_4_ = uVar55;
                  auVar150._16_4_ = uVar55;
                  auVar150._20_4_ = uVar55;
                  auVar150._24_4_ = uVar55;
                  auVar150._28_4_ = uVar55;
                  uVar55 = *(undefined4 *)((long)&(local_1838->org).field_0 + 8);
                  auVar152._4_4_ = uVar55;
                  auVar152._0_4_ = uVar55;
                  auVar152._8_4_ = uVar55;
                  auVar152._12_4_ = uVar55;
                  auVar152._16_4_ = uVar55;
                  auVar152._20_4_ = uVar55;
                  auVar152._24_4_ = uVar55;
                  auVar152._28_4_ = uVar55;
                  auVar11 = vsubps_avx(auVar15,auVar141);
                  auVar15 = vsubps_avx(auVar102,auVar150);
                  auVar12 = vsubps_avx(auVar16,auVar152);
                  auVar102 = vsubps_avx(auVar59,auVar141);
                  auVar78 = vsubps_avx(auVar68,auVar150);
                  auVar118 = vsubps_avx(auVar83,auVar152);
                  auVar103 = vsubps_avx(auVar109,auVar141);
                  auVar13 = vsubps_avx(auVar157,auVar150);
                  auVar14 = vsubps_avx(auVar113,auVar152);
                  local_1380 = vsubps_avx(auVar103,auVar11);
                  local_13c0 = vsubps_avx(auVar13,auVar15);
                  local_13a0 = vsubps_avx(auVar14,auVar12);
                  auVar93._0_4_ = auVar103._0_4_ + auVar11._0_4_;
                  auVar93._4_4_ = auVar103._4_4_ + auVar11._4_4_;
                  auVar93._8_4_ = auVar103._8_4_ + auVar11._8_4_;
                  auVar93._12_4_ = auVar103._12_4_ + auVar11._12_4_;
                  auVar93._16_4_ = auVar103._16_4_ + auVar11._16_4_;
                  auVar93._20_4_ = auVar103._20_4_ + auVar11._20_4_;
                  auVar93._24_4_ = auVar103._24_4_ + auVar11._24_4_;
                  auVar93._28_4_ = auVar103._28_4_ + auVar11._28_4_;
                  auVar110._0_4_ = auVar15._0_4_ + auVar13._0_4_;
                  auVar110._4_4_ = auVar15._4_4_ + auVar13._4_4_;
                  auVar110._8_4_ = auVar15._8_4_ + auVar13._8_4_;
                  auVar110._12_4_ = auVar15._12_4_ + auVar13._12_4_;
                  auVar110._16_4_ = auVar15._16_4_ + auVar13._16_4_;
                  auVar110._20_4_ = auVar15._20_4_ + auVar13._20_4_;
                  auVar110._24_4_ = auVar15._24_4_ + auVar13._24_4_;
                  auVar110._28_4_ = auVar15._28_4_ + auVar13._28_4_;
                  fVar123 = auVar12._0_4_;
                  auVar114._0_4_ = fVar123 + auVar14._0_4_;
                  fVar129 = auVar12._4_4_;
                  auVar114._4_4_ = fVar129 + auVar14._4_4_;
                  fVar131 = auVar12._8_4_;
                  auVar114._8_4_ = fVar131 + auVar14._8_4_;
                  fVar133 = auVar12._12_4_;
                  auVar114._12_4_ = fVar133 + auVar14._12_4_;
                  fVar135 = auVar12._16_4_;
                  auVar114._16_4_ = fVar135 + auVar14._16_4_;
                  fVar137 = auVar12._20_4_;
                  auVar114._20_4_ = fVar137 + auVar14._20_4_;
                  fVar139 = auVar12._24_4_;
                  auVar114._24_4_ = fVar139 + auVar14._24_4_;
                  fVar62 = auVar12._28_4_;
                  auVar114._28_4_ = fVar62 + auVar14._28_4_;
                  auVar22._4_4_ = local_13a0._4_4_ * auVar110._4_4_;
                  auVar22._0_4_ = local_13a0._0_4_ * auVar110._0_4_;
                  auVar22._8_4_ = local_13a0._8_4_ * auVar110._8_4_;
                  auVar22._12_4_ = local_13a0._12_4_ * auVar110._12_4_;
                  auVar22._16_4_ = local_13a0._16_4_ * auVar110._16_4_;
                  auVar22._20_4_ = local_13a0._20_4_ * auVar110._20_4_;
                  auVar22._24_4_ = local_13a0._24_4_ * auVar110._24_4_;
                  auVar22._28_4_ = auVar16._28_4_;
                  auVar105 = vfmsub231ps_fma(auVar22,local_13c0,auVar114);
                  auVar23._4_4_ = local_1380._4_4_ * auVar114._4_4_;
                  auVar23._0_4_ = local_1380._0_4_ * auVar114._0_4_;
                  auVar23._8_4_ = local_1380._8_4_ * auVar114._8_4_;
                  auVar23._12_4_ = local_1380._12_4_ * auVar114._12_4_;
                  auVar23._16_4_ = local_1380._16_4_ * auVar114._16_4_;
                  auVar23._20_4_ = local_1380._20_4_ * auVar114._20_4_;
                  auVar23._24_4_ = local_1380._24_4_ * auVar114._24_4_;
                  auVar23._28_4_ = auVar114._28_4_;
                  auVar96 = vfmsub231ps_fma(auVar23,local_13a0,auVar93);
                  auVar24._4_4_ = local_13c0._4_4_ * auVar93._4_4_;
                  auVar24._0_4_ = local_13c0._0_4_ * auVar93._0_4_;
                  auVar24._8_4_ = local_13c0._8_4_ * auVar93._8_4_;
                  auVar24._12_4_ = local_13c0._12_4_ * auVar93._12_4_;
                  auVar24._16_4_ = local_13c0._16_4_ * auVar93._16_4_;
                  auVar24._20_4_ = local_13c0._20_4_ * auVar93._20_4_;
                  auVar24._24_4_ = local_13c0._24_4_ * auVar93._24_4_;
                  auVar24._28_4_ = auVar93._28_4_;
                  local_1760._4_4_ = (local_1838->dir).field_0.m128[2];
                  auVar10 = vfmsub231ps_fma(auVar24,local_1380,auVar110);
                  auVar94._0_4_ = local_1760._4_4_ * auVar10._0_4_;
                  auVar94._4_4_ = local_1760._4_4_ * auVar10._4_4_;
                  auVar94._8_4_ = local_1760._4_4_ * auVar10._8_4_;
                  auVar94._12_4_ = local_1760._4_4_ * auVar10._12_4_;
                  auVar94._16_4_ = local_1760._4_4_ * 0.0;
                  auVar94._20_4_ = local_1760._4_4_ * 0.0;
                  auVar94._24_4_ = local_1760._4_4_ * 0.0;
                  auVar94._28_4_ = 0;
                  uVar55 = *(undefined4 *)((long)&(local_1838->dir).field_0 + 4);
                  auVar151._4_4_ = uVar55;
                  auVar151._0_4_ = uVar55;
                  auVar151._8_4_ = uVar55;
                  auVar151._12_4_ = uVar55;
                  auVar151._16_4_ = uVar55;
                  auVar151._20_4_ = uVar55;
                  auVar151._24_4_ = uVar55;
                  auVar151._28_4_ = uVar55;
                  auVar96 = vfmadd231ps_fma(auVar94,auVar151,ZEXT1632(auVar96));
                  uVar55 = *(undefined4 *)&(local_1838->dir).field_0;
                  auVar145._4_4_ = uVar55;
                  auVar145._0_4_ = uVar55;
                  auVar145._8_4_ = uVar55;
                  auVar145._12_4_ = uVar55;
                  auVar145._16_4_ = uVar55;
                  auVar145._20_4_ = uVar55;
                  auVar145._24_4_ = uVar55;
                  auVar145._28_4_ = uVar55;
                  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar145,ZEXT1632(auVar105));
                  local_13e0 = vsubps_avx(auVar15,auVar78);
                  local_1400 = vsubps_avx(auVar12,auVar118);
                  auVar111._0_4_ = auVar15._0_4_ + auVar78._0_4_;
                  auVar111._4_4_ = auVar15._4_4_ + auVar78._4_4_;
                  auVar111._8_4_ = auVar15._8_4_ + auVar78._8_4_;
                  auVar111._12_4_ = auVar15._12_4_ + auVar78._12_4_;
                  auVar111._16_4_ = auVar15._16_4_ + auVar78._16_4_;
                  auVar111._20_4_ = auVar15._20_4_ + auVar78._20_4_;
                  auVar111._24_4_ = auVar15._24_4_ + auVar78._24_4_;
                  auVar111._28_4_ = auVar15._28_4_ + auVar78._28_4_;
                  auVar115._0_4_ = fVar123 + auVar118._0_4_;
                  auVar115._4_4_ = fVar129 + auVar118._4_4_;
                  auVar115._8_4_ = fVar131 + auVar118._8_4_;
                  auVar115._12_4_ = fVar133 + auVar118._12_4_;
                  auVar115._16_4_ = fVar135 + auVar118._16_4_;
                  auVar115._20_4_ = fVar137 + auVar118._20_4_;
                  auVar115._24_4_ = fVar139 + auVar118._24_4_;
                  auVar115._28_4_ = fVar62 + auVar118._28_4_;
                  fVar75 = local_1400._0_4_;
                  fVar70 = local_1400._4_4_;
                  auVar25._4_4_ = auVar111._4_4_ * fVar70;
                  auVar25._0_4_ = auVar111._0_4_ * fVar75;
                  fVar72 = local_1400._8_4_;
                  auVar25._8_4_ = auVar111._8_4_ * fVar72;
                  auVar97._0_4_ = local_1400._12_4_;
                  auVar25._12_4_ = auVar111._12_4_ * auVar97._0_4_;
                  fVar76 = local_1400._16_4_;
                  auVar25._16_4_ = auVar111._16_4_ * fVar76;
                  fVar88 = local_1400._20_4_;
                  auVar25._20_4_ = auVar111._20_4_ * fVar88;
                  fVar155 = local_1400._24_4_;
                  auVar25._24_4_ = auVar111._24_4_ * fVar155;
                  auVar25._28_4_ = fVar62;
                  auVar10 = vfmsub231ps_fma(auVar25,local_13e0,auVar115);
                  local_1420 = vsubps_avx(auVar11,auVar102);
                  fVar156 = local_1420._0_4_;
                  fVar159 = local_1420._4_4_;
                  auVar26._4_4_ = fVar159 * auVar115._4_4_;
                  auVar26._0_4_ = fVar156 * auVar115._0_4_;
                  fVar160 = local_1420._8_4_;
                  auVar26._8_4_ = fVar160 * auVar115._8_4_;
                  fVar161 = local_1420._12_4_;
                  auVar26._12_4_ = fVar161 * auVar115._12_4_;
                  fVar162 = local_1420._16_4_;
                  auVar26._16_4_ = fVar162 * auVar115._16_4_;
                  fVar163 = local_1420._20_4_;
                  auVar26._20_4_ = fVar163 * auVar115._20_4_;
                  fVar164 = local_1420._24_4_;
                  auVar26._24_4_ = fVar164 * auVar115._24_4_;
                  auVar26._28_4_ = local_1380._28_4_;
                  auVar116._0_4_ = auVar11._0_4_ + auVar102._0_4_;
                  auVar116._4_4_ = auVar11._4_4_ + auVar102._4_4_;
                  auVar116._8_4_ = auVar11._8_4_ + auVar102._8_4_;
                  auVar116._12_4_ = auVar11._12_4_ + auVar102._12_4_;
                  auVar116._16_4_ = auVar11._16_4_ + auVar102._16_4_;
                  auVar116._20_4_ = auVar11._20_4_ + auVar102._20_4_;
                  auVar116._24_4_ = auVar11._24_4_ + auVar102._24_4_;
                  auVar116._28_4_ = auVar11._28_4_ + auVar102._28_4_;
                  auVar105 = vfmsub231ps_fma(auVar26,local_1400,auVar116);
                  fVar62 = local_13e0._0_4_;
                  fVar71 = local_13e0._4_4_;
                  auVar27._4_4_ = auVar116._4_4_ * fVar71;
                  auVar27._0_4_ = auVar116._0_4_ * fVar62;
                  fVar73 = local_13e0._8_4_;
                  auVar27._8_4_ = auVar116._8_4_ * fVar73;
                  fVar74 = local_13e0._12_4_;
                  auVar27._12_4_ = auVar116._12_4_ * fVar74;
                  fVar87 = local_13e0._16_4_;
                  auVar27._16_4_ = auVar116._16_4_ * fVar87;
                  fVar89 = local_13e0._20_4_;
                  auVar27._20_4_ = auVar116._20_4_ * fVar89;
                  auVar91._0_4_ = local_13e0._24_4_;
                  auVar27._24_4_ = auVar116._24_4_ * auVar91._0_4_;
                  auVar27._28_4_ = auVar116._28_4_;
                  auVar106 = vfmsub231ps_fma(auVar27,local_1420,auVar111);
                  auVar117._0_4_ = local_1760._4_4_ * auVar106._0_4_;
                  auVar117._4_4_ = local_1760._4_4_ * auVar106._4_4_;
                  auVar117._8_4_ = local_1760._4_4_ * auVar106._8_4_;
                  auVar117._12_4_ = local_1760._4_4_ * auVar106._12_4_;
                  auVar117._16_4_ = local_1760._4_4_ * 0.0;
                  auVar117._20_4_ = local_1760._4_4_ * 0.0;
                  auVar117._24_4_ = local_1760._4_4_ * 0.0;
                  auVar117._28_4_ = 0;
                  auVar105 = vfmadd231ps_fma(auVar117,auVar151,ZEXT1632(auVar105));
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar145,ZEXT1632(auVar10));
                  auVar16 = vsubps_avx(auVar102,auVar103);
                  auVar98._0_4_ = auVar102._0_4_ + auVar103._0_4_;
                  auVar98._4_4_ = auVar102._4_4_ + auVar103._4_4_;
                  auVar98._8_4_ = auVar102._8_4_ + auVar103._8_4_;
                  auVar98._12_4_ = auVar102._12_4_ + auVar103._12_4_;
                  auVar98._16_4_ = auVar102._16_4_ + auVar103._16_4_;
                  auVar98._20_4_ = auVar102._20_4_ + auVar103._20_4_;
                  auVar98._24_4_ = auVar102._24_4_ + auVar103._24_4_;
                  auVar98._28_4_ = auVar102._28_4_ + auVar103._28_4_;
                  auVar103 = vsubps_avx(auVar78,auVar13);
                  auVar120._0_4_ = auVar78._0_4_ + auVar13._0_4_;
                  auVar120._4_4_ = auVar78._4_4_ + auVar13._4_4_;
                  auVar120._8_4_ = auVar78._8_4_ + auVar13._8_4_;
                  auVar120._12_4_ = auVar78._12_4_ + auVar13._12_4_;
                  auVar120._16_4_ = auVar78._16_4_ + auVar13._16_4_;
                  auVar120._20_4_ = auVar78._20_4_ + auVar13._20_4_;
                  auVar120._24_4_ = auVar78._24_4_ + auVar13._24_4_;
                  auVar120._28_4_ = auVar78._28_4_ + auVar13._28_4_;
                  auVar13 = vsubps_avx(auVar118,auVar14);
                  auVar84._0_4_ = auVar118._0_4_ + auVar14._0_4_;
                  auVar84._4_4_ = auVar118._4_4_ + auVar14._4_4_;
                  auVar84._8_4_ = auVar118._8_4_ + auVar14._8_4_;
                  auVar84._12_4_ = auVar118._12_4_ + auVar14._12_4_;
                  auVar84._16_4_ = auVar118._16_4_ + auVar14._16_4_;
                  auVar84._20_4_ = auVar118._20_4_ + auVar14._20_4_;
                  auVar84._24_4_ = auVar118._24_4_ + auVar14._24_4_;
                  auVar84._28_4_ = auVar118._28_4_ + auVar14._28_4_;
                  auVar126._0_4_ = auVar120._0_4_ * auVar13._0_4_;
                  auVar126._4_4_ = auVar120._4_4_ * auVar13._4_4_;
                  auVar126._8_4_ = auVar120._8_4_ * auVar13._8_4_;
                  auVar126._12_4_ = auVar120._12_4_ * auVar13._12_4_;
                  auVar126._16_4_ = auVar120._16_4_ * auVar13._16_4_;
                  auVar126._20_4_ = auVar120._20_4_ * auVar13._20_4_;
                  auVar126._24_4_ = auVar120._24_4_ * auVar13._24_4_;
                  auVar126._28_4_ = 0;
                  auVar106 = vfmsub231ps_fma(auVar126,auVar103,auVar84);
                  auVar28._4_4_ = auVar84._4_4_ * auVar16._4_4_;
                  auVar28._0_4_ = auVar84._0_4_ * auVar16._0_4_;
                  auVar28._8_4_ = auVar84._8_4_ * auVar16._8_4_;
                  auVar28._12_4_ = auVar84._12_4_ * auVar16._12_4_;
                  auVar28._16_4_ = auVar84._16_4_ * auVar16._16_4_;
                  auVar28._20_4_ = auVar84._20_4_ * auVar16._20_4_;
                  auVar28._24_4_ = auVar84._24_4_ * auVar16._24_4_;
                  auVar28._28_4_ = auVar84._28_4_;
                  auVar10 = vfmsub231ps_fma(auVar28,auVar13,auVar98);
                  auVar29._4_4_ = auVar98._4_4_ * auVar103._4_4_;
                  auVar29._0_4_ = auVar98._0_4_ * auVar103._0_4_;
                  auVar29._8_4_ = auVar98._8_4_ * auVar103._8_4_;
                  auVar29._12_4_ = auVar98._12_4_ * auVar103._12_4_;
                  auVar29._16_4_ = auVar98._16_4_ * auVar103._16_4_;
                  auVar29._20_4_ = auVar98._20_4_ * auVar103._20_4_;
                  auVar29._24_4_ = auVar98._24_4_ * auVar103._24_4_;
                  auVar29._28_4_ = auVar98._28_4_;
                  auVar107 = vfmsub231ps_fma(auVar29,auVar16,auVar120);
                  local_1760._0_4_ = local_1760._4_4_;
                  fStack_1758 = local_1760._4_4_;
                  fStack_1754 = local_1760._4_4_;
                  fStack_1750 = local_1760._4_4_;
                  fStack_174c = local_1760._4_4_;
                  fStack_1748 = local_1760._4_4_;
                  fStack_1744 = local_1760._4_4_;
                  auVar99._0_4_ = local_1760._4_4_ * auVar107._0_4_;
                  auVar99._4_4_ = local_1760._4_4_ * auVar107._4_4_;
                  auVar99._8_4_ = local_1760._4_4_ * auVar107._8_4_;
                  auVar99._12_4_ = local_1760._4_4_ * auVar107._12_4_;
                  auVar99._16_4_ = local_1760._4_4_ * 0.0;
                  auVar99._20_4_ = local_1760._4_4_ * 0.0;
                  auVar99._24_4_ = local_1760._4_4_ * 0.0;
                  auVar99._28_4_ = 0;
                  auVar10 = vfmadd231ps_fma(auVar99,auVar151,ZEXT1632(auVar10));
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar145,ZEXT1632(auVar106));
                  fVar144 = auVar10._0_4_ + auVar96._0_4_ + auVar105._0_4_;
                  fVar147 = auVar10._4_4_ + auVar96._4_4_ + auVar105._4_4_;
                  fVar148 = auVar10._8_4_ + auVar96._8_4_ + auVar105._8_4_;
                  fVar149 = auVar10._12_4_ + auVar96._12_4_ + auVar105._12_4_;
                  local_16e0 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar148,CONCAT44(fVar147,fVar144)
                                                                  )));
                  local_16c0 = ZEXT1632(auVar96);
                  auVar102 = vminps_avx(local_16c0,ZEXT1632(auVar105));
                  auVar102 = vminps_avx(auVar102,ZEXT1632(auVar10));
                  auVar85._8_4_ = 0x7fffffff;
                  auVar85._0_8_ = 0x7fffffff7fffffff;
                  auVar85._12_4_ = 0x7fffffff;
                  auVar85._16_4_ = 0x7fffffff;
                  auVar85._20_4_ = 0x7fffffff;
                  auVar85._24_4_ = 0x7fffffff;
                  auVar85._28_4_ = 0x7fffffff;
                  local_14c0 = vandps_avx(local_16e0,auVar85);
                  fVar124 = local_14c0._0_4_ * 1.1920929e-07;
                  fVar130 = local_14c0._4_4_ * 1.1920929e-07;
                  auVar30._4_4_ = fVar130;
                  auVar30._0_4_ = fVar124;
                  fVar132 = local_14c0._8_4_ * 1.1920929e-07;
                  auVar30._8_4_ = fVar132;
                  fVar134 = local_14c0._12_4_ * 1.1920929e-07;
                  auVar30._12_4_ = fVar134;
                  fVar136 = local_14c0._16_4_ * 1.1920929e-07;
                  auVar30._16_4_ = fVar136;
                  fVar138 = local_14c0._20_4_ * 1.1920929e-07;
                  auVar30._20_4_ = fVar138;
                  fVar140 = local_14c0._24_4_ * 1.1920929e-07;
                  auVar30._24_4_ = fVar140;
                  auVar30._28_4_ = 0x34000000;
                  auVar142._0_8_ = CONCAT44(fVar130,fVar124) ^ 0x8000000080000000;
                  auVar142._8_4_ = -fVar132;
                  auVar142._12_4_ = -fVar134;
                  auVar142._16_4_ = -fVar136;
                  auVar142._20_4_ = -fVar138;
                  auVar142._24_4_ = -fVar140;
                  auVar142._28_4_ = 0xb4000000;
                  auVar102 = vcmpps_avx(auVar102,auVar142,5);
                  auVar118 = ZEXT1632(auVar105);
                  auVar78 = vmaxps_avx(local_16c0,auVar118);
                  auVar78 = vmaxps_avx(auVar78,ZEXT1632(auVar10));
                  auVar78 = vcmpps_avx(auVar78,auVar30,2);
                  local_1440 = vorps_avx(auVar102,auVar78);
                  auVar78 = local_14e0 & local_1440;
                  ray = local_1838;
                  puVar48 = local_1828;
                  uVar49 = local_1840;
                  uVar50 = local_1848;
                  uVar51 = local_1850;
                  if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar78 >> 0x7f,0) != '\0') ||
                        (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar78 >> 0xbf,0) != '\0') ||
                      (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar78[0x1f] < '\0') {
                    local_1460 = 0x80000000;
                    uStack_145c = 0x80000000;
                    uStack_1458 = 0x80000000;
                    uStack_1454 = 0x80000000;
                    uStack_1450 = 0x80000000;
                    uStack_144c = 0x80000000;
                    uStack_1448 = 0x80000000;
                    uStack_1444 = 0x80000000;
                    auVar31._4_4_ = local_13a0._4_4_ * fVar71;
                    auVar31._0_4_ = local_13a0._0_4_ * fVar62;
                    auVar31._8_4_ = local_13a0._8_4_ * fVar73;
                    auVar31._12_4_ = local_13a0._12_4_ * fVar74;
                    auVar31._16_4_ = local_13a0._16_4_ * fVar87;
                    auVar31._20_4_ = local_13a0._20_4_ * fVar89;
                    auVar31._24_4_ = local_13a0._24_4_ * auVar91._0_4_;
                    auVar31._28_4_ = local_1440._28_4_;
                    auVar32._4_4_ = local_13c0._4_4_ * fVar159;
                    auVar32._0_4_ = local_13c0._0_4_ * fVar156;
                    auVar32._8_4_ = local_13c0._8_4_ * fVar160;
                    auVar32._12_4_ = local_13c0._12_4_ * fVar161;
                    auVar32._16_4_ = local_13c0._16_4_ * fVar162;
                    auVar32._20_4_ = local_13c0._20_4_ * fVar163;
                    auVar32._24_4_ = local_13c0._24_4_ * fVar164;
                    auVar32._28_4_ = auVar102._28_4_;
                    auVar96 = vfmsub213ps_fma(local_13c0,local_1400,auVar31);
                    auVar33._4_4_ = fVar70 * auVar103._4_4_;
                    auVar33._0_4_ = fVar75 * auVar103._0_4_;
                    auVar33._8_4_ = fVar72 * auVar103._8_4_;
                    auVar33._12_4_ = auVar97._0_4_ * auVar103._12_4_;
                    auVar33._16_4_ = fVar76 * auVar103._16_4_;
                    auVar33._20_4_ = fVar88 * auVar103._20_4_;
                    auVar33._24_4_ = fVar155 * auVar103._24_4_;
                    auVar33._28_4_ = 0x34000000;
                    auVar34._4_4_ = fVar159 * auVar13._4_4_;
                    auVar34._0_4_ = fVar156 * auVar13._0_4_;
                    auVar34._8_4_ = fVar160 * auVar13._8_4_;
                    auVar34._12_4_ = fVar161 * auVar13._12_4_;
                    auVar34._16_4_ = fVar162 * auVar13._16_4_;
                    auVar34._20_4_ = fVar163 * auVar13._20_4_;
                    auVar34._24_4_ = fVar164 * auVar13._24_4_;
                    auVar34._28_4_ = 0;
                    auVar10 = vfmsub213ps_fma(auVar13,local_13e0,auVar33);
                    auVar102 = vandps_avx(auVar31,auVar85);
                    auVar78 = vandps_avx(auVar33,auVar85);
                    auVar102 = vcmpps_avx(auVar102,auVar78,1);
                    auVar13 = vblendvps_avx(ZEXT1632(auVar10),ZEXT1632(auVar96),auVar102);
                    auVar35._4_4_ = fVar71 * auVar16._4_4_;
                    auVar35._0_4_ = fVar62 * auVar16._0_4_;
                    auVar35._8_4_ = fVar73 * auVar16._8_4_;
                    auVar35._12_4_ = fVar74 * auVar16._12_4_;
                    auVar35._16_4_ = fVar87 * auVar16._16_4_;
                    auVar35._20_4_ = fVar89 * auVar16._20_4_;
                    auVar35._24_4_ = auVar91._0_4_ * auVar16._24_4_;
                    auVar35._28_4_ = auVar102._28_4_;
                    auVar96 = vfmsub213ps_fma(auVar16,local_1400,auVar34);
                    auVar60._0_4_ = local_1380._0_4_ * fVar75;
                    auVar60._4_4_ = local_1380._4_4_ * fVar70;
                    auVar60._8_4_ = local_1380._8_4_ * fVar72;
                    auVar60._12_4_ = local_1380._12_4_ * auVar97._0_4_;
                    auVar60._16_4_ = local_1380._16_4_ * fVar76;
                    auVar60._20_4_ = local_1380._20_4_ * fVar88;
                    auVar60._24_4_ = local_1380._24_4_ * fVar155;
                    auVar60._28_4_ = 0;
                    auVar10 = vfmsub213ps_fma(local_13a0,local_1420,auVar60);
                    auVar102 = vandps_avx(auVar60,auVar85);
                    auVar78 = vandps_avx(auVar34,auVar85);
                    auVar102 = vcmpps_avx(auVar102,auVar78,1);
                    auVar14 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar10),auVar102);
                    auVar96 = vfmsub213ps_fma(local_1380,local_13e0,auVar32);
                    auVar10 = vfmsub213ps_fma(auVar103,local_1420,auVar35);
                    auVar102 = vandps_avx(auVar32,auVar85);
                    auVar78 = vandps_avx(auVar35,auVar85);
                    auVar78 = vcmpps_avx(auVar102,auVar78,1);
                    auVar102 = vblendvps_avx(ZEXT1632(auVar10),ZEXT1632(auVar96),auVar78);
                    fVar62 = auVar102._0_4_;
                    fVar70 = auVar102._4_4_;
                    auVar36._4_4_ = fVar70 * local_1760._4_4_;
                    auVar36._0_4_ = fVar62 * local_1760._4_4_;
                    fVar71 = auVar102._8_4_;
                    auVar36._8_4_ = fVar71 * local_1760._4_4_;
                    fVar72 = auVar102._12_4_;
                    auVar36._12_4_ = fVar72 * local_1760._4_4_;
                    fVar73 = auVar102._16_4_;
                    auVar36._16_4_ = fVar73 * local_1760._4_4_;
                    auVar97._0_4_ = auVar102._20_4_;
                    auVar36._20_4_ = auVar97._0_4_ * local_1760._4_4_;
                    fVar74 = auVar102._24_4_;
                    auVar36._24_4_ = fVar74 * local_1760._4_4_;
                    auVar36._28_4_ = auVar78._28_4_;
                    auVar96 = vfmadd213ps_fma(auVar151,auVar14,auVar36);
                    auVar96 = vfmadd213ps_fma(auVar145,auVar13,ZEXT1632(auVar96));
                    fVar76 = auVar96._0_4_ + auVar96._0_4_;
                    fVar87 = auVar96._4_4_ + auVar96._4_4_;
                    fVar88 = auVar96._8_4_ + auVar96._8_4_;
                    fVar89 = auVar96._12_4_ + auVar96._12_4_;
                    auVar103 = ZEXT1632(CONCAT412(fVar89,CONCAT48(fVar88,CONCAT44(fVar87,fVar76))));
                    auVar100._0_4_ = fVar62 * fVar123;
                    auVar100._4_4_ = fVar70 * fVar129;
                    auVar100._8_4_ = fVar71 * fVar131;
                    auVar100._12_4_ = fVar72 * fVar133;
                    auVar100._16_4_ = fVar73 * fVar135;
                    auVar100._20_4_ = auVar97._0_4_ * fVar137;
                    auVar100._24_4_ = fVar74 * fVar139;
                    auVar100._28_4_ = 0;
                    auVar96 = vfmadd213ps_fma(auVar15,auVar14,auVar100);
                    auVar102 = vrcpps_avx(auVar103);
                    auVar10 = vfmadd213ps_fma(auVar11,auVar13,ZEXT1632(auVar96));
                    auVar127._8_4_ = 0x3f800000;
                    auVar127._0_8_ = &DAT_3f8000003f800000;
                    auVar127._12_4_ = 0x3f800000;
                    auVar127._16_4_ = 0x3f800000;
                    auVar127._20_4_ = 0x3f800000;
                    auVar127._24_4_ = 0x3f800000;
                    auVar127._28_4_ = 0x3f800000;
                    auVar96 = vfnmadd213ps_fma(auVar102,auVar103,auVar127);
                    auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar102,auVar102);
                    local_1280 = ZEXT1632(CONCAT412((auVar10._12_4_ + auVar10._12_4_) *
                                                    auVar96._12_4_,
                                                    CONCAT48((auVar10._8_4_ + auVar10._8_4_) *
                                                             auVar96._8_4_,
                                                             CONCAT44((auVar10._4_4_ + auVar10._4_4_
                                                                      ) * auVar96._4_4_,
                                                                      (auVar10._0_4_ + auVar10._0_4_
                                                                      ) * auVar96._0_4_))));
                    uVar55 = *(undefined4 *)((long)&(local_1838->org).field_0 + 0xc);
                    auVar101._4_4_ = uVar55;
                    auVar101._0_4_ = uVar55;
                    auVar101._8_4_ = uVar55;
                    auVar101._12_4_ = uVar55;
                    auVar101._16_4_ = uVar55;
                    auVar101._20_4_ = uVar55;
                    auVar101._24_4_ = uVar55;
                    auVar101._28_4_ = uVar55;
                    auVar102 = vcmpps_avx(auVar101,local_1280,2);
                    fVar75 = local_1838->tfar;
                    auVar121._4_4_ = fVar75;
                    auVar121._0_4_ = fVar75;
                    auVar121._8_4_ = fVar75;
                    auVar121._12_4_ = fVar75;
                    auVar121._16_4_ = fVar75;
                    auVar121._20_4_ = fVar75;
                    auVar121._24_4_ = fVar75;
                    auVar121._28_4_ = fVar75;
                    auVar78 = vcmpps_avx(local_1280,auVar121,2);
                    auVar102 = vandps_avx(auVar78,auVar102);
                    auVar122._0_8_ = CONCAT44(fVar87,fVar76) ^ 0x8000000080000000;
                    auVar122._8_4_ = -fVar88;
                    auVar122._12_4_ = -fVar89;
                    auVar122._16_4_ = 0x80000000;
                    auVar122._20_4_ = 0x80000000;
                    auVar122._24_4_ = 0x80000000;
                    auVar122._28_4_ = 0x80000000;
                    auVar78 = vcmpps_avx(auVar103,auVar122,4);
                    auVar102 = vandps_avx(auVar78,auVar102);
                    auVar78 = vandps_avx(local_1440,local_14e0);
                    auVar102 = vpslld_avx2(auVar102,0x1f);
                    auVar103 = vpsrad_avx2(auVar102,0x1f);
                    auVar102 = auVar78 & auVar103;
                    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar102 >> 0x7f,0) != '\0') ||
                          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar102 >> 0xbf,0) != '\0') ||
                        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar102[0x1f] < '\0') {
                      local_12e0 = vandps_avx(auVar103,auVar78);
                      local_1300 = &local_1851;
                      auVar102 = vsubps_avx(local_16e0,auVar118);
                      auVar102 = vblendvps_avx(local_16c0,auVar102,local_1480);
                      auVar78 = vsubps_avx(local_16e0,local_16c0);
                      auVar78 = vblendvps_avx(auVar118,auVar78,local_1480);
                      local_1260[0] = auVar13._0_4_ * (float)local_14a0._0_4_;
                      local_1260[1] = auVar13._4_4_ * (float)local_14a0._4_4_;
                      local_1260[2] = auVar13._8_4_ * fStack_1498;
                      local_1260[3] = auVar13._12_4_ * fStack_1494;
                      fStack_1250 = auVar13._16_4_ * fStack_1490;
                      fStack_124c = auVar13._20_4_ * fStack_148c;
                      fStack_1248 = auVar13._24_4_ * fStack_1488;
                      uStack_1244 = 0;
                      local_1240[0] = (float)local_14a0._0_4_ * auVar14._0_4_;
                      local_1240[1] = (float)local_14a0._4_4_ * auVar14._4_4_;
                      local_1240[2] = fStack_1498 * auVar14._8_4_;
                      local_1240[3] = fStack_1494 * auVar14._12_4_;
                      fStack_1230 = fStack_1490 * auVar14._16_4_;
                      fStack_122c = fStack_148c * auVar14._20_4_;
                      fStack_1228 = fStack_1488 * auVar14._24_4_;
                      uStack_1224 = auVar14._28_4_;
                      local_1220[0] = (float)local_14a0._0_4_ * fVar62;
                      local_1220[1] = (float)local_14a0._4_4_ * fVar70;
                      local_1220[2] = fStack_1498 * fVar71;
                      local_1220[3] = fStack_1494 * fVar72;
                      fStack_1210 = fStack_1490 * fVar73;
                      fStack_120c = fStack_148c * auVar97._0_4_;
                      fStack_1208 = fStack_1488 * fVar74;
                      uStack_1204 = auVar14._28_4_;
                      auVar61._0_8_ = (ulong)CONCAT24(uVar7,(uint)uVar7) & 0x7fff00007fff;
                      auVar61._8_4_ = local_1818;
                      auVar61._12_4_ = local_1818;
                      auVar61._16_4_ = local_1818;
                      auVar61._20_4_ = local_1818;
                      auVar61._24_4_ = local_1818;
                      auVar61._28_4_ = local_1818;
                      auVar118 = vpaddd_avx2(auVar61,_DAT_0205d4c0);
                      auVar69._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                      auVar69._8_4_ = local_181c;
                      auVar69._12_4_ = local_181c;
                      auVar69._16_4_ = local_181c;
                      auVar69._20_4_ = local_181c;
                      auVar69._24_4_ = local_181c;
                      auVar69._28_4_ = local_181c;
                      auVar103 = vpaddd_avx2(auVar69,_DAT_0205d4e0);
                      auVar92._0_4_ = (float)(int)(*(ushort *)(local_1770 + 8 + local_1778) - 1);
                      auVar92._4_12_ = auVar105._4_12_;
                      auVar96 = vrcpss_avx(auVar92,auVar92);
                      auVar10 = vfnmadd213ss_fma(auVar92,auVar96,SUB6416(ZEXT464(0x40000000),0));
                      fStack_1348 = auVar96._0_4_ * auVar10._0_4_;
                      auVar108._0_4_ = (float)(int)(*(ushort *)(local_1770 + 10 + local_1778) - 1);
                      auVar108._4_12_ = auVar105._4_12_;
                      auVar96 = vrcpss_avx(auVar108,auVar108);
                      auVar105 = vfnmadd213ss_fma(auVar108,auVar96,SUB6416(ZEXT464(0x40000000),0));
                      fVar75 = auVar96._0_4_ * auVar105._0_4_;
                      auVar118 = vcvtdq2ps_avx(auVar118);
                      fStack_1344 = auVar118._28_4_ + auVar102._28_4_;
                      local_1360 = (fVar144 * auVar118._0_4_ + auVar102._0_4_) * fStack_1348;
                      fStack_135c = (fVar147 * auVar118._4_4_ + auVar102._4_4_) * fStack_1348;
                      fStack_1358 = (fVar148 * auVar118._8_4_ + auVar102._8_4_) * fStack_1348;
                      fStack_1354 = (fVar149 * auVar118._12_4_ + auVar102._12_4_) * fStack_1348;
                      fStack_1350 = (auVar118._16_4_ * 0.0 + auVar102._16_4_) * fStack_1348;
                      fStack_134c = (auVar118._20_4_ * 0.0 + auVar102._20_4_) * fStack_1348;
                      fStack_1348 = (auVar118._24_4_ * 0.0 + auVar102._24_4_) * fStack_1348;
                      auVar102 = vcvtdq2ps_avx(auVar103);
                      fVar62 = (fVar144 * auVar102._0_4_ + auVar78._0_4_) * fVar75;
                      fVar70 = (fVar147 * auVar102._4_4_ + auVar78._4_4_) * fVar75;
                      local_1340._4_4_ = fVar70;
                      local_1340._0_4_ = fVar62;
                      fVar71 = (fVar148 * auVar102._8_4_ + auVar78._8_4_) * fVar75;
                      local_1340._8_4_ = fVar71;
                      fVar72 = (fVar149 * auVar102._12_4_ + auVar78._12_4_) * fVar75;
                      local_1340._12_4_ = fVar72;
                      fVar73 = (auVar102._16_4_ * 0.0 + auVar78._16_4_) * fVar75;
                      local_1340._16_4_ = fVar73;
                      auVar97._0_4_ = (auVar102._20_4_ * 0.0 + auVar78._20_4_) * fVar75;
                      local_1340._20_4_ = auVar97._0_4_;
                      fVar75 = (auVar102._24_4_ * 0.0 + auVar78._24_4_) * fVar75;
                      local_1340._24_4_ = fVar75;
                      local_1340._28_4_ = auVar102._28_4_ + auVar78._28_4_;
                      pGVar43 = (local_1808->geometries).items[local_1810].ptr;
                      if ((pGVar43->mask & local_1838->mask) != 0) {
                        pRVar45 = local_1830->args;
                        if ((pRVar45->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar43->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00536695:
                          auVar128 = ZEXT3264(local_1500);
                          auVar143 = ZEXT3264(local_1520);
                          auVar146 = ZEXT3264(local_1540);
                          auVar153 = ZEXT3264(local_1580);
                          auVar154 = ZEXT3264(local_15a0);
                          auVar158 = ZEXT3264(local_15e0);
                          auVar104 = ZEXT3264(local_1600);
                          auVar112 = ZEXT3264(local_1620);
                          auVar119 = ZEXT3264(local_1640);
                          auVar97._0_4_ = local_1560;
                          fVar75 = fStack_155c;
                          fVar62 = fStack_1558;
                          fVar70 = fStack_1554;
                          fVar71 = fStack_1550;
                          fVar72 = fStack_154c;
                          fVar73 = fStack_1548;
                          auVar91._0_4_ = local_15c0;
                          fVar74 = fStack_15bc;
                          fVar76 = fStack_15b8;
                          fVar87 = fStack_15b4;
                          fVar88 = fStack_15b0;
                          fVar89 = fStack_15ac;
                          fVar155 = fStack_15a8;
                          goto LAB_005366fc;
                        }
                        auVar102 = vrcpps_avx(local_16e0);
                        auVar95._8_4_ = 0x3f800000;
                        auVar95._0_8_ = &DAT_3f8000003f800000;
                        auVar95._12_4_ = 0x3f800000;
                        auVar95._16_4_ = 0x3f800000;
                        auVar95._20_4_ = 0x3f800000;
                        auVar95._24_4_ = 0x3f800000;
                        auVar95._28_4_ = 0x3f800000;
                        auVar96 = vfnmadd213ps_fma(local_16e0,auVar102,auVar95);
                        auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar102,auVar102);
                        auVar86._8_4_ = 0x219392ef;
                        auVar86._0_8_ = 0x219392ef219392ef;
                        auVar86._12_4_ = 0x219392ef;
                        auVar86._16_4_ = 0x219392ef;
                        auVar86._20_4_ = 0x219392ef;
                        auVar86._24_4_ = 0x219392ef;
                        auVar86._28_4_ = 0x219392ef;
                        auVar102 = vcmpps_avx(local_14c0,auVar86,5);
                        auVar102 = vandps_avx(ZEXT1632(auVar96),auVar102);
                        auVar37._4_4_ = fStack_135c * auVar102._4_4_;
                        auVar37._0_4_ = local_1360 * auVar102._0_4_;
                        auVar37._8_4_ = fStack_1358 * auVar102._8_4_;
                        auVar37._12_4_ = fStack_1354 * auVar102._12_4_;
                        auVar37._16_4_ = fStack_1350 * auVar102._16_4_;
                        auVar37._20_4_ = fStack_134c * auVar102._20_4_;
                        auVar37._24_4_ = fStack_1348 * auVar102._24_4_;
                        auVar37._28_4_ = fStack_1344;
                        local_12c0 = vminps_avx(auVar37,auVar95);
                        auVar38._4_4_ = fVar70 * auVar102._4_4_;
                        auVar38._0_4_ = fVar62 * auVar102._0_4_;
                        auVar38._8_4_ = fVar71 * auVar102._8_4_;
                        auVar38._12_4_ = fVar72 * auVar102._12_4_;
                        auVar38._16_4_ = fVar73 * auVar102._16_4_;
                        auVar38._20_4_ = auVar97._0_4_ * auVar102._20_4_;
                        auVar38._24_4_ = fVar75 * auVar102._24_4_;
                        auVar38._28_4_ = local_12c0._28_4_;
                        local_12a0 = vminps_avx(auVar38,auVar95);
                        uVar39 = vmovmskps_avx(local_12e0);
                        local_16a0._1_31_ = auVar12._1_31_;
                        local_16a0[0] = uVar39 == 0;
                        if (uVar39 != 0) {
                          uVar52 = CONCAT44(0,uVar39 & 0xff);
                          local_1760 = uVar52;
                          lVar41 = 0;
                          for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
                            lVar41 = lVar41 + 1;
                          }
                          auStack_17f8 = auVar151._8_24_;
                          local_1800 = local_1830->user;
                          auStack_1658 = auVar11._8_24_;
                          local_1660 = pGVar43;
                          auStack_1678 = auVar15._8_24_;
                          local_1680 = pRVar45;
                          local_1320 = local_16e0;
                          do {
                            local_1734 = *(undefined4 *)(local_12c0 + lVar41 * 4);
                            local_1730 = *(undefined4 *)(local_12a0 + lVar41 * 4);
                            local_16e0._0_4_ = ray->tfar;
                            ray->tfar = local_1260[lVar41 + -8];
                            local_1740 = local_1260[lVar41];
                            local_173c = local_1240[lVar41];
                            local_16c0._0_8_ = lVar41;
                            local_1738 = local_1220[lVar41];
                            local_172c = (undefined4)local_17d0;
                            local_1728 = (undefined4)local_1810;
                            local_1724 = local_1800->instID[0];
                            local_1720 = local_1800->instPrimID[0];
                            local_1814 = -1;
                            local_1710.valid = &local_1814;
                            local_1710.geometryUserPtr = pGVar43->userPtr;
                            local_1710.context = local_1800;
                            local_1710.hit = (RTCHitN *)&local_1740;
                            local_1710.N = 1;
                            local_1710.ray = (RTCRayN *)ray;
                            if (pGVar43->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00536556:
                              if (pRVar45->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar45->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar43->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar45->filter)(&local_1710);
                                  pGVar43 = local_1660;
                                  pRVar45 = local_1680;
                                  ray = local_1838;
                                  puVar48 = local_1828;
                                  uVar49 = local_1840;
                                  uVar50 = local_1848;
                                  uVar51 = local_1850;
                                }
                                if (*local_1710.valid == 0) goto LAB_005365b1;
                              }
                              if ((local_16a0 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              goto LAB_00536695;
                              break;
                            }
                            (*pGVar43->occlusionFilterN)(&local_1710);
                            pGVar43 = local_1660;
                            pRVar45 = local_1680;
                            ray = local_1838;
                            puVar48 = local_1828;
                            uVar49 = local_1840;
                            uVar50 = local_1848;
                            uVar51 = local_1850;
                            if (*local_1710.valid != 0) goto LAB_00536556;
LAB_005365b1:
                            ray->tfar = (float)local_16e0._0_4_;
                            uVar42 = local_1760 ^ 1L << (local_16c0._0_8_ & 0x3f);
                            local_1760 = uVar42;
                            lVar41 = 0;
                            for (uVar52 = uVar42; (uVar52 & 1) == 0;
                                uVar52 = uVar52 >> 1 | 0x8000000000000000) {
                              lVar41 = lVar41 + 1;
                            }
                            local_16a0[0] = uVar42 == 0;
                          } while (uVar42 != 0);
                        }
                      }
                    }
                  }
                  local_1788 = local_1788 - 1 & local_1788;
                  auVar128 = ZEXT3264(local_1500);
                  auVar143 = ZEXT3264(local_1520);
                  auVar146 = ZEXT3264(local_1540);
                  auVar153 = ZEXT3264(local_1580);
                  auVar154 = ZEXT3264(local_15a0);
                  auVar158 = ZEXT3264(local_15e0);
                  auVar97._0_4_ = local_1560;
                  fVar75 = fStack_155c;
                  fVar62 = fStack_1558;
                  fVar70 = fStack_1554;
                  fVar71 = fStack_1550;
                  fVar72 = fStack_154c;
                  fVar73 = fStack_1548;
                  auVar91._0_4_ = local_15c0;
                  fVar74 = fStack_15bc;
                  fVar76 = fStack_15b8;
                  fVar87 = fStack_15b4;
                  fVar88 = fStack_15b0;
                  fVar89 = fStack_15ac;
                  fVar155 = fStack_15a8;
                } while (local_1788 != 0);
              }
              auVar119 = ZEXT3264(local_1640);
              auVar112 = ZEXT3264(local_1620);
              auVar104 = ZEXT3264(local_1600);
              local_1780 = local_1780 + 1;
              bVar57 = local_1780 < local_17c8;
            } while (local_1780 != local_17c8);
          }
LAB_005366fc:
          iVar40 = 0;
          if (bVar57) {
            ray->tfar = -INFINITY;
            iVar40 = 3;
          }
        }
      } while (iVar40 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }